

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<google::protobuf::UnknownField>::InternalDeallocate<true>
          (RepeatedField<google::protobuf::UnknownField> *this)

{
  int iVar1;
  HeapRep *pHVar2;
  LongSooRep *this_00;
  Finder *this_01;
  Finder FStack_38;
  code *pcStack_30;
  LongSooRep local_20;
  
  if ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
      (undefined1  [16])0x0) {
    this_00 = &local_20;
    pcStack_30 = heap_rep;
    InternalDeallocate<true>((RepeatedField<google::protobuf::UnknownField> *)this_00);
    if ((this_00->elements_int & 4) != 0) {
      internal::LongSooRep::elements(this_00);
      return;
    }
    this_01 = &FStack_38;
    heap_rep();
    TextFormat::Finder::~Finder(this_01);
    operator_delete(this_01,0x10);
    return;
  }
  iVar1 = (this->soo_rep_).field_0.long_rep.capacity;
  pcStack_30 = (code *)0x21519a;
  pHVar2 = heap_rep(this);
  if ((pHVar2->field_0).arena != (Arena *)0x0) {
    return;
  }
  pcStack_30 = (code *)0x2151b8;
  pHVar2 = heap_rep(this);
  operator_delete(pHVar2,(long)iVar1 * 0x10 + 0x10);
  return;
}

Assistant:

bool is_soo() const { return (arena_and_size & kNotSooBit) == 0; }